

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall
cfd::core::Psbt::SetTxOutData
          (Psbt *this,uint32_t index,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  CfdException *pCVar6;
  undefined4 in_register_00000034;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script local_140;
  Script new_redeem_script;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  ByteData256 empty_bytes;
  Txid txid;
  Script script;
  
  uVar3 = (ulong)index;
  (*this->_vptr_Psbt[3])(this,CONCAT44(in_register_00000034,index),0xb8b,"SetTxOutData");
  pvVar1 = this->wally_psbt_pointer_;
  lVar2 = *(long *)(*(long *)((long)pvVar1 + 8) + 0x20);
  ByteData::ByteData((ByteData *)&new_redeem_script,*(uint8_t **)(lVar2 + 8 + uVar3 * 0x70),
                     *(uint32_t *)(lVar2 + 0x10 + uVar3 * 0x70));
  Script::Script(&script,(ByteData *)&new_redeem_script);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&new_redeem_script);
  ByteData256::ByteData256(&empty_bytes);
  Txid::Txid(&txid,&empty_bytes);
  Script::Script(&new_redeem_script,redeem_script);
  bVar4 = ValidatePsbtUtxo(&txid,index,&script,redeem_script,key_list,&new_redeem_script);
  bVar5 = Script::IsEmpty(&new_redeem_script);
  if (!bVar5) {
    Script::GetData((ByteData *)&local_140,&new_redeem_script);
    ByteData::GetBytes(&script_val,(ByteData *)&local_140);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
    if (bVar4) {
      bVar4 = Script::IsP2wpkhScript(&new_redeem_script);
      if (!bVar4) {
        ret = wally_psbt_output_set_witness_script
                        (uVar3 * 0xd0 + *(long *)((long)pvVar1 + 0x28),
                         script_val.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (long)script_val.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)script_val.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        if (ret != 0) {
          local_140._vptr_Script = (_func_int **)0x22e1c0;
          local_140.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0xba0;
          local_140.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "SetTxOutData";
          logger::warn<int&>((CfdSourceLocation *)&local_140,
                             "wally_psbt_output_set_witness_script NG[{}]",&ret);
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&local_140,"psbt add output witness script error.",
                     (allocator *)&local_b8);
          CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_140);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
        bVar4 = Script::IsP2shScript(&script);
        if (bVar4) {
          ScriptUtil::CreateP2wshLockingScript(&local_140,&new_redeem_script);
          Script::GetData((ByteData *)&local_d0,&local_140);
          ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,
                             (ByteData *)&local_d0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script_val,&local_b8)
          ;
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_b8);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_d0);
          Script::~Script(&local_140);
        }
        else if (script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish !=
                 script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start) {
          script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
    }
    if (script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ret = wally_psbt_output_set_redeem_script
                      (uVar3 * 0xd0 + *(long *)((long)pvVar1 + 0x28),
                       script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)script_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      if (ret != 0) {
        local_140._vptr_Script = (_func_int **)0x22e1c0;
        local_140.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0xbb2;
        local_140.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetTxOutData";
        logger::warn<int&>((CfdSourceLocation *)&local_140,
                           "wally_psbt_output_set_redeem_script NG[{}]",&ret);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&local_140,"psbt add output redeem script error.",
                   (allocator *)&local_b8);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_140);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if ((key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (key_list->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    SetKeyPathMap(key_list,(wally_map *)(*(long *)((long)pvVar1 + 0x28) + uVar3 * 0xd0 + 0x20));
    ret = wally_map_sort(*(long *)((long)pvVar1 + 0x28) + uVar3 * 0xd0 + 0x20,0);
    if (ret != 0) {
      local_140._vptr_Script = (_func_int **)0x22e1c0;
      local_140.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xbbd;
      local_140.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = "SetTxOutData";
      logger::warn<int&>((CfdSourceLocation *)&local_140,"wally_map_sort NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&local_140,"psbt output sort keypaths error.",(allocator *)&script_val);
      CfdException::CfdException(pCVar6,kCfdInternalError,(string *)&local_140);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  Script::~Script(&new_redeem_script);
  Txid::~Txid(&txid);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_bytes);
  Script::~Script(&script);
  return;
}

Assistant:

void Psbt::SetTxOutData(
    uint32_t index, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  struct wally_tx_output *txout = &psbt_pointer->tx->outputs[index];
  Script script(
      ByteData(txout->script, static_cast<uint32_t>(txout->script_len)));
  ByteData256 empty_bytes;
  Txid txid(empty_bytes);
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, index, script, redeem_script, key_list, &new_redeem_script);

  int ret;
  if (!new_redeem_script.IsEmpty()) {
    auto script_val = new_redeem_script.GetData().GetBytes();
    if (is_witness && (!new_redeem_script.IsP2wpkhScript())) {
      ret = wally_psbt_output_set_witness_script(
          &psbt_pointer->outputs[index], script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_output_set_witness_script NG[{}]",
            ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add output witness script error.");
      }
      if (script.IsP2shScript()) {
        script_val = ScriptUtil::CreateP2wshLockingScript(new_redeem_script)
                         .GetData()
                         .GetBytes();
      } else {
        script_val.clear();
      }
    }
    if (!script_val.empty()) {
      ret = wally_psbt_output_set_redeem_script(
          &psbt_pointer->outputs[index], script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_output_set_redeem_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add output redeem script error.");
      }
    }
  }

  if (!key_list.empty()) {
    SetKeyPathMap(key_list, &psbt_pointer->outputs[index].keypaths);
    ret = wally_map_sort(&psbt_pointer->outputs[index].keypaths, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(
          kCfdInternalError, "psbt output sort keypaths error.");
    }
  }
}